

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

Vec_Que_t * Vec_QueAlloc(int nCap)

{
  size_t __size;
  uint uVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  
  pVVar2 = (Vec_Que_t *)calloc(1,0x20);
  uVar1 = 0x10;
  if (0x10 < nCap) {
    uVar1 = nCap;
  }
  pVVar2->nSize = 1;
  pVVar2->nCap = uVar1 + 1;
  __size = (ulong)uVar1 * 4 + 4;
  piVar3 = (int *)malloc(__size);
  memset(piVar3,0xff,__size);
  pVVar2->pHeap = piVar3;
  piVar3 = (int *)malloc(__size);
  memset(piVar3,0xff,__size);
  pVVar2->pOrder = piVar3;
  return pVVar2;
}

Assistant:

static inline Vec_Que_t * Vec_QueAlloc( int nCap )
{
    Vec_Que_t * p;
    p = ABC_CALLOC( Vec_Que_t, 1 );
    if ( nCap < 16 )
        nCap = 16;
    p->nSize  = 1;
    p->nCap   = nCap + 1;
    p->pHeap  = ABC_FALLOC( int, p->nCap );
    p->pOrder = ABC_FALLOC( int, p->nCap );
    return p;
}